

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

string * skiwi::skiwi_expand(string *__return_storage_ptr__,string *scheme_expression)

{
  runtime_error *this;
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> env_copy;
  format_options format_ops;
  cinput_data cinput;
  repl_data rd_copy;
  Program prog;
  runtime_error e;
  ostream local_190 [376];
  
  if ((anonymous_namespace)::cd != '\0') {
    make_deep_copy<skiwi::environment_entry>
              ((skiwi *)&env_copy,
               (shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&DAT_002b3910);
    make_deep_copy(&rd_copy,(repl_data *)&DAT_002b3878);
    prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header;
    prog.expressions.
    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    prog.expressions.
    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    prog.expressions.
    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    prog.quotes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ = 0;
    prog.quotes._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ = 0;
    prog.alpha_converted = false;
    prog.assignable_variables_converted = false;
    prog.define_converted = false;
    prog.closure_converted = false;
    prog.cps_converted = false;
    prog.free_variables_analysed = false;
    prog.linear_scan_indices_computed = false;
    prog.lambda_to_let_converted = false;
    prog.include_handled = false;
    prog.simplified_to_core_forms = false;
    prog.single_begin_conversion = false;
    prog.tail_call_analysis = false;
    prog.global_define_env_allocated = false;
    prog.quotes_collected = false;
    prog.quotes_converted = false;
    prog.quasiquotes_converted = false;
    prog.inline_primitives_converted = false;
    prog.constant_folded = false;
    prog.constant_propagated = false;
    prog.macros_expanded = false;
    prog.single_begins_removed = false;
    prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         prog.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    tokenize(&tokens,scheme_expression);
    std::
    __reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
              (tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
               super__Vector_impl_data._M_start,
               tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
               super__Vector_impl_data._M_finish);
    make_program((Program *)&e,&tokens);
    Program::operator=(&prog,(Program *)&e);
    Program::~Program((Program *)&e);
    std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&tokens);
    cinput.parameters.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cinput.parameters.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cinput.parameters.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    preprocess((environment_map *)&DAT_002b3910,(repl_data *)&DAT_002b3878,
               (macro_data *)&DAT_002b38c8,(context *)&DAT_002b3720,&cinput,&prog,
               (primitive_map *)&DAT_002b3938,(compiler_options *)&DAT_002b36f4);
    std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
    operator=((__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
               *)&DAT_002b3910,
              &env_copy.
               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             );
    repl_data::operator=((repl_data *)&DAT_002b3878,&rd_copy);
    std::__cxx11::stringstream::stringstream((stringstream *)&e);
    dump(local_190,&prog,true);
    format_options::format_options(&format_ops);
    format_ops.indent_offset = 2;
    format_ops.max_width = 10;
    format_ops.min_width = 5;
    std::__cxx11::stringbuf::str();
    format(__return_storage_ptr__,(string *)&tokens,&format_ops);
    std::__cxx11::string::~string((string *)&tokens);
    std::__cxx11::stringstream::~stringstream((stringstream *)&e);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
    ::~vector(&cinput.parameters);
    Program::~Program(&prog);
    repl_data::~repl_data(&rd_copy);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&env_copy.
                super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Skiwi is not initialized");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string skiwi_expand(const std::string& scheme_expression)
  {
  using namespace SKIWI;
  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");
  auto env_copy = make_deep_copy(cd.env);
  auto rd_copy = make_deep_copy(cd.rd);
  Program prog;
  try
    {
    auto tokens = tokenize(scheme_expression);
    std::reverse(tokens.begin(), tokens.end());
    prog = make_program(tokens);
    }
  catch (std::logic_error e)
    {
    cd.env = env_copy;
    cd.rd = rd_copy;
    return e.what();
    }
  catch (std::runtime_error e)
    {
    cd.env = env_copy;
    cd.rd = rd_copy;
    return e.what();
    }
  cinput_data cinput;
  preprocess(cd.env, cd.rd, cd.md, cd.ctxt, cinput, prog, cd.pm, cd.ops);
  cd.env = env_copy;
  cd.rd = rd_copy;
  std::stringstream ss;
  dump(ss, prog);
  format_options format_ops;
  format_ops.indent_offset = 2;
  format_ops.min_width = 5;
  format_ops.max_width = 10;
  return format(ss.str(), format_ops);
  }